

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_accessors.c
# Opt level: O0

uint32_t aec_get_lsb_24(aec_stream *strm)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint32_t data;
  aec_stream *strm_local;
  
  bVar1 = strm->next_in[2];
  bVar2 = strm->next_in[1];
  bVar3 = *strm->next_in;
  strm->next_in = strm->next_in + 3;
  strm->avail_in = strm->avail_in - 3;
  return (uint)bVar1 << 0x10 | (uint)bVar2 << 8 | (uint)bVar3;
}

Assistant:

uint32_t aec_get_lsb_24(struct aec_stream *strm)
{
    uint32_t data;

    data = ((uint32_t)strm->next_in[2] << 16)
        | ((uint32_t)strm->next_in[1] << 8)
        | (uint32_t)strm->next_in[0];

    strm->next_in += 3;
    strm->avail_in -= 3;
    return data;
}